

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O1

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::FastBinaryPacking<32U>,_FastPForLib::VariableByte>::
_encodeArray<unsigned_int>
          (CompositeCodec<FastPForLib::FastBinaryPacking<32U>,_FastPForLib::VariableByte> *this,
          uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  logic_error *this_00;
  ulong length_00;
  size_t nvalue1;
  size_t nvalue2;
  ulong local_40;
  size_t local_38;
  
  local_40 = *nvalue;
  if (local_40 != 0) {
    length_00 = length & 0xffffffffffffff80;
    FastBinaryPacking<32U>::encodeArray(&this->codec1,in,length_00,out,&local_40);
    if (length_00 != length) {
      local_38 = *nvalue - local_40;
      if (*nvalue < local_40) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"Encode run over output buffer. Potential buffer overflow!");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      VariableByte::_encodeArray<unsigned_int>
                (&this->codec2,in + length_00,(ulong)((uint)length & 0x7f),out + local_40,&local_38)
      ;
      local_40 = local_38 + local_40;
    }
    *nvalue = local_40;
  }
  return;
}

Assistant:

void _encodeArray(const IntType *in, const size_t length, uint32_t *out,
                    size_t &nvalue) {
    if (nvalue == 0) {
      return;
    }
    const size_t roundedlength = length / Codec1::BlockSize * Codec1::BlockSize;
    size_t nvalue1 = nvalue;
    codec1.encodeArray(in, roundedlength, out, nvalue1);

    if (roundedlength < length) {
      if (nvalue1 > nvalue) {
        throw std::logic_error(
            "Encode run over output buffer. Potential buffer overflow!");
      }
      size_t nvalue2 = nvalue - nvalue1;
      codec2.encodeArray(in + roundedlength, length - roundedlength,
                         out + nvalue1, nvalue2);
      nvalue = nvalue1 + nvalue2;
    } else {
      nvalue = nvalue1;
    }
  }